

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

QString * __thiscall QFSFileEngine::fileName(QFSFileEngine *this,FileName file)

{
  bool bVar1;
  QFSFileEnginePrivate *data;
  QFileSystemEntry *entry_00;
  uint in_EDX;
  QFileSystemMetaData *in_RSI;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  QFileSystemEntry entry_3;
  QFileSystemEntry entry_2;
  QFileSystemEntry entry_1;
  QFileSystemEntry entry;
  QFileSystemEntry *in_stack_fffffffffffffed8;
  QFileSystemEntry *this_00;
  undefined4 in_stack_ffffffffffffff00;
  QFileSystemEntry *link;
  undefined1 local_e8 [56];
  undefined1 local_b0 [56];
  undefined1 local_78 [56];
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  link = in_RDI;
  data = d_func((QFSFileEngine *)0x18d731);
  entry_00 = (QFileSystemEntry *)(ulong)in_EDX;
  switch(entry_00) {
  case (QFileSystemEntry *)0x0:
  case (QFileSystemEntry *)0xb:
  default:
    QFileSystemEntry::filePath(this_00);
    break;
  case (QFileSystemEntry *)0x1:
    QFileSystemEntry::fileName(this_00);
    break;
  case (QFileSystemEntry *)0x2:
    QFileSystemEntry::path(this_00);
    break;
  case (QFileSystemEntry *)0x3:
  case (QFileSystemEntry *)0x4:
    memset(local_40,0xaa,0x38);
    QFileSystemEngine::absoluteName(entry_00);
    if (in_EDX == 4) {
      QFileSystemEntry::path(this_00);
    }
    else {
      QFileSystemEntry::filePath(this_00);
    }
    QFileSystemEntry::~QFileSystemEntry(in_RDI);
    break;
  case (QFileSystemEntry *)0x5:
    bVar1 = QFSFileEnginePrivate::isSymlink
                      ((QFSFileEnginePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffff00));
    if (bVar1) {
      memset(local_b0,0xaa,0x38);
      QFileSystemEngine::getLinkTarget(link,in_RSI);
      QFileSystemEntry::filePath(this_00);
      QFileSystemEntry::~QFileSystemEntry(in_RDI);
    }
    else {
      QString::QString((QString *)0x18d8f0);
    }
    break;
  case (QFileSystemEntry *)0x6:
  case (QFileSystemEntry *)0x7:
    memset(local_78,0xaa,0x38);
    QFileSystemEngine::canonicalName
              ((QFileSystemEntry *)CONCAT44(in_EDX,in_stack_ffffffffffffff00),
               (QFileSystemMetaData *)data);
    if (in_EDX == 7) {
      QFileSystemEntry::path(this_00);
    }
    else {
      QFileSystemEntry::filePath(this_00);
    }
    QFileSystemEntry::~QFileSystemEntry(in_RDI);
    break;
  case (QFileSystemEntry *)0x8:
    QFileSystemEngine::bundleName(in_stack_fffffffffffffed8);
    break;
  case (QFileSystemEntry *)0x9:
    QString::QString((QString *)0x18d966);
    break;
  case (QFileSystemEntry *)0xa:
    bVar1 = QFSFileEnginePrivate::isSymlink
                      ((QFSFileEnginePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffff00));
    if (bVar1) {
      memset(local_e8,0xaa,0x38);
      QFileSystemEngine::getRawLinkPath(link,in_RSI);
      QFileSystemEntry::filePath(this_00);
      QFileSystemEntry::~QFileSystemEntry(in_RDI);
    }
    else {
      QString::QString((QString *)0x18d95a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &this_00->m_filePath;
}

Assistant:

QString QFSFileEngine::fileName(FileName file) const
{
    Q_D(const QFSFileEngine);
    switch (file) {
    case BundleName:
        return QFileSystemEngine::bundleName(d->fileEntry);
    case BaseName:
        return d->fileEntry.fileName();
    case PathName:
        return d->fileEntry.path();
    case AbsoluteName:
    case AbsolutePathName: {
        QFileSystemEntry entry(QFileSystemEngine::absoluteName(d->fileEntry));
        return file == AbsolutePathName ? entry.path() : entry.filePath();
    }
    case CanonicalName:
    case CanonicalPathName: {
        QFileSystemEntry entry(QFileSystemEngine::canonicalName(d->fileEntry, d->metaData));
        return file == CanonicalPathName ? entry.path() : entry.filePath();
    }
    case AbsoluteLinkTarget:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getLinkTarget(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case RawLinkPath:
        if (d->isSymlink()) {
            QFileSystemEntry entry = QFileSystemEngine::getRawLinkPath(d->fileEntry, d->metaData);
            return entry.filePath();
        }
        return QString();
    case JunctionName:
        return QString();
    case DefaultName:
    case NFileNames:
        break;
    }
    return d->fileEntry.filePath();
}